

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-test.cpp
# Opt level: O0

CommandOptions * write_JP2K_S_file(CommandOptions *Options)

{
  char *pcVar1;
  int iVar2;
  AESEncContext *this;
  HMACContext *this_00;
  CommandOptions *in_RSI;
  bool bVar3;
  Result_t local_900 [104];
  FrameBuffer local_898 [2];
  FrameBuffer local_830 [2];
  FrameBuffer local_7c8 [2];
  FrameBuffer local_760 [2];
  Result_t local_6f8 [104];
  Result_t local_690 [104];
  uint local_628;
  allocator<char> local_621;
  ui32_t duration;
  string local_600 [104];
  Result_t local_598 [104];
  Result_t local_530 [104];
  Result_t local_4c8 [111];
  FortunaRNG local_459;
  undefined1 local_458 [7];
  FortunaRNG RNG;
  WriterInfo Info;
  undefined1 local_3a0 [304];
  byte_t IV_buf [16];
  SequenceParser ParserRight;
  SequenceParser local_258 [8];
  SequenceParser ParserLeft;
  undefined1 local_244 [8];
  PictureDescriptor PDesc;
  undefined1 local_60 [8];
  FrameBuffer FrameBuffer;
  MXFSWriter Writer;
  HMACContext *HMAC;
  AESEncContext *Context;
  CommandOptions *Options_local;
  Result_t *result;
  
  ASDCP::JP2K::MXFSWriter::MXFSWriter((MXFSWriter *)&FrameBuffer.field_0x20);
  ASDCP::JP2K::FrameBuffer::FrameBuffer((FrameBuffer *)local_60,in_RSI->fb_size);
  ASDCP::JP2K::PictureDescriptor::PictureDescriptor((PictureDescriptor *)local_244);
  ASDCP::JP2K::SequenceParser::SequenceParser(local_258);
  ASDCP::JP2K::SequenceParser::SequenceParser((SequenceParser *)(IV_buf + 8));
  if (in_RSI->file_count == 2) {
    local_3a0[0x123] = '\0';
    pcVar1 = in_RSI->filenames[0];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_3a0 + 0x100),pcVar1,(allocator<char> *)(local_3a0 + 0xff));
    ASDCP::JP2K::SequenceParser::OpenRead((string *)Options,SUB81(local_258,0));
    std::__cxx11::string::~string((string *)(local_3a0 + 0x100));
    std::allocator<char>::~allocator((allocator<char> *)(local_3a0 + 0xff));
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
    if (-1 < iVar2) {
      pcVar1 = in_RSI->filenames[1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_3a0 + 0x70),pcVar1,(allocator<char> *)(local_3a0 + 0x6f));
      ASDCP::JP2K::SequenceParser::OpenRead
                ((string *)(local_3a0 + 0x90),(bool)((char)IV_buf + '\b'));
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)(local_3a0 + 0x90));
      Kumu::Result_t::~Result_t((Result_t *)(local_3a0 + 0x90));
      std::__cxx11::string::~string((string *)(local_3a0 + 0x70));
      std::allocator<char>::~allocator((allocator<char> *)(local_3a0 + 0x6f));
    }
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
    if (-1 < iVar2) {
      ASDCP::JP2K::SequenceParser::FillPictureDescriptor((PictureDescriptor *)local_3a0);
      Kumu::Result_t::~Result_t((Result_t *)local_3a0);
      Info._168_8_ = CommandOptions::PictureRate(in_RSI);
      local_244 = (undefined1  [8])Info._168_8_;
      if ((in_RSI->verbose_flag & 1U) != 0) {
        fputs("JPEG 2000 stereoscopic pictures\nPictureDescriptor:\n",_stderr);
        fprintf(_stderr,"Frame Buffer size: %u\n",(ulong)in_RSI->fb_size);
        ASDCP::JP2K::PictureDescriptorDump((PictureDescriptor *)local_244,(_IO_FILE *)0x0);
      }
    }
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
    if ((-1 < iVar2) && ((in_RSI->no_write_flag & 1U) == 0)) {
      ASDCP::WriterInfo::WriterInfo((WriterInfo *)local_458,&s_MyInfo.super_WriterInfo);
      if ((in_RSI->asset_id_flag & 1U) == 0) {
        Kumu::GenRandomUUID(Info.ProductUUID + 8);
      }
      else {
        Info.ProductUUID._8_8_ = *(undefined8 *)in_RSI->asset_id_value;
        Info.AssetUUID._0_8_ = *(undefined8 *)(in_RSI->asset_id_value + 8);
      }
      if ((in_RSI->use_smpte_labels & 1U) != 0) {
        Info.ProductName.field_2._8_4_ = 2;
        fprintf(_stderr,"ATTENTION! Writing SMPTE Universal Labels\n");
      }
      if ((in_RSI->key_flag & 1U) != 0) {
        Kumu::FortunaRNG::FortunaRNG(&local_459);
        Kumu::GenRandomUUID(Info.AssetUUID + 8);
        Info.CryptographicKeyID[8] = '\x01';
        if ((in_RSI->key_id_flag & 1U) == 0) {
          Kumu::FortunaRNG::FillRandom((uchar *)&local_459,(int)&Info + 0x28);
        }
        else {
          Info.ContextID._8_8_ = *(undefined8 *)in_RSI->key_id_value;
          Info.CryptographicKeyID._0_8_ = *(undefined8 *)(in_RSI->key_id_value + 8);
        }
        this = (AESEncContext *)operator_new(8);
        ASDCP::AESEncContext::AESEncContext(this);
        ASDCP::AESEncContext::InitKey((uchar *)local_4c8);
        Kumu::Result_t::operator=((Result_t *)Options,local_4c8);
        Kumu::Result_t::~Result_t(local_4c8);
        iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
        if (-1 < iVar2) {
          Kumu::FortunaRNG::FillRandom((uchar *)&local_459,(int)local_3a0 + 0x128);
          ASDCP::AESEncContext::SetIVec((uchar *)local_530);
          Kumu::Result_t::operator=((Result_t *)Options,local_530);
          Kumu::Result_t::~Result_t(local_530);
        }
        iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
        if ((-1 < iVar2) && ((in_RSI->write_hmac & 1U) != 0)) {
          Info.CryptographicKeyID[9] = '\x01';
          this_00 = (HMACContext *)operator_new(8);
          ASDCP::HMACContext::HMACContext(this_00);
          ASDCP::HMACContext::InitKey((uchar *)local_598,(LabelSet_t)this_00);
          Kumu::Result_t::operator=((Result_t *)Options,local_598);
          Kumu::Result_t::~Result_t(local_598);
        }
        Kumu::FortunaRNG::~FortunaRNG(&local_459);
      }
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if (-1 < iVar2) {
        pcVar1 = in_RSI->out_file;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&duration,pcVar1,&local_621);
        ASDCP::JP2K::MXFSWriter::OpenWrite
                  (local_600,(WriterInfo *)&FrameBuffer.field_0x20,(PictureDescriptor *)&duration,
                   (uint)local_458);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_600);
        Kumu::Result_t::~Result_t((Result_t *)local_600);
        std::__cxx11::string::~string((string *)&duration);
        std::allocator<char>::~allocator(&local_621);
      }
      ASDCP::WriterInfo::~WriterInfo((WriterInfo *)local_458);
    }
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
    if (-1 < iVar2) {
      local_628 = 0;
      ASDCP::JP2K::SequenceParser::Reset();
      Kumu::Result_t::operator=((Result_t *)Options,local_690);
      Kumu::Result_t::~Result_t(local_690);
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if (-1 < iVar2) {
        ASDCP::JP2K::SequenceParser::Reset();
        Kumu::Result_t::operator=((Result_t *)Options,local_6f8);
        Kumu::Result_t::~Result_t(local_6f8);
      }
      while( true ) {
        iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
        bVar3 = false;
        if (-1 < iVar2) {
          bVar3 = local_628 < in_RSI->duration;
          local_628 = local_628 + 1;
        }
        if (!bVar3) break;
        ASDCP::JP2K::SequenceParser::ReadFrame(local_760);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_760);
        Kumu::Result_t::~Result_t((Result_t *)local_760);
        iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
        if (-1 < iVar2) {
          if ((in_RSI->verbose_flag & 1U) != 0) {
            ASDCP::JP2K::FrameBuffer::Dump((_IO_FILE *)local_60,(uint)_stderr);
          }
          if ((in_RSI->encrypt_header_flag & 1U) != 0) {
            ASDCP::FrameBuffer::PlaintextOffset((FrameBuffer *)local_60,0);
          }
        }
        iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
        if ((-1 < iVar2) && ((in_RSI->no_write_flag & 1U) == 0)) {
          ASDCP::JP2K::MXFSWriter::WriteFrame
                    (local_7c8,(int)&FrameBuffer + 0x20,(AESEncContext *)local_60,(HMACContext *)0x0
                    );
          Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_7c8);
          Kumu::Result_t::~Result_t((Result_t *)local_7c8);
        }
        iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
        if (-1 < iVar2) {
          ASDCP::JP2K::SequenceParser::ReadFrame(local_830);
          Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_830);
          Kumu::Result_t::~Result_t((Result_t *)local_830);
        }
        iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
        if (-1 < iVar2) {
          if ((in_RSI->verbose_flag & 1U) != 0) {
            ASDCP::JP2K::FrameBuffer::Dump((_IO_FILE *)local_60,(uint)_stderr);
          }
          if ((in_RSI->encrypt_header_flag & 1U) != 0) {
            ASDCP::FrameBuffer::PlaintextOffset((FrameBuffer *)local_60,0);
          }
        }
        iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
        if ((-1 < iVar2) && ((in_RSI->no_write_flag & 1U) == 0)) {
          ASDCP::JP2K::MXFSWriter::WriteFrame
                    (local_898,(int)&FrameBuffer + 0x20,(AESEncContext *)local_60,(HMACContext *)0x1
                    );
          Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_898);
          Kumu::Result_t::~Result_t((Result_t *)local_898);
        }
      }
      bVar3 = Kumu::Result_t::operator==((Result_t *)Options,(Result_t *)Kumu::RESULT_ENDOFFILE);
      if (bVar3) {
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)Kumu::RESULT_OK);
      }
    }
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
    if ((-1 < iVar2) && ((in_RSI->no_write_flag & 1U) == 0)) {
      ASDCP::JP2K::MXFSWriter::Finalize();
      Kumu::Result_t::operator=((Result_t *)Options,local_900);
      Kumu::Result_t::~Result_t(local_900);
    }
    local_3a0[0x123] = '\x01';
  }
  else {
    fprintf(_stderr,"Two inputs are required for stereoscopic option.\n");
    Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)Kumu::RESULT_FAIL);
  }
  local_3a0[0x124] = '\x01';
  local_3a0[0x125] = '\0';
  local_3a0[0x126] = '\0';
  local_3a0[0x127] = '\0';
  ASDCP::JP2K::SequenceParser::~SequenceParser((SequenceParser *)(IV_buf + 8));
  ASDCP::JP2K::SequenceParser::~SequenceParser(local_258);
  ASDCP::JP2K::FrameBuffer::~FrameBuffer((FrameBuffer *)local_60);
  ASDCP::JP2K::MXFSWriter::~MXFSWriter((MXFSWriter *)&FrameBuffer.field_0x20);
  return Options;
}

Assistant:

Result_t
write_JP2K_S_file(CommandOptions& Options)
{
  AESEncContext*          Context = 0;
  HMACContext*            HMAC = 0;
  JP2K::MXFSWriter        Writer;
  JP2K::FrameBuffer       FrameBuffer(Options.fb_size);
  JP2K::PictureDescriptor PDesc;
  JP2K::SequenceParser    ParserLeft, ParserRight;
  byte_t                  IV_buf[CBC_BLOCK_SIZE];

  if ( Options.file_count != 2 )
    {
      fprintf(stderr, "Two inputs are required for stereoscopic option.\n");
      return RESULT_FAIL;
    }

  // set up essence parser
  Result_t result = ParserLeft.OpenRead(Options.filenames[0], Options.j2c_pedantic);

  if ( ASDCP_SUCCESS(result) )
    result = ParserRight.OpenRead(Options.filenames[1], Options.j2c_pedantic);

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
    {
      ParserLeft.FillPictureDescriptor(PDesc);
      PDesc.EditRate = Options.PictureRate();

      if ( Options.verbose_flag )
	{
	  fputs("JPEG 2000 stereoscopic pictures\nPictureDescriptor:\n", stderr);
          fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
	  JP2K::PictureDescriptorDump(PDesc);
	}
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    {
      WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
      if ( Options.asset_id_flag )
	memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
      else
	Kumu::GenRandomUUID(Info.AssetUUID);

      if ( Options.use_smpte_labels )
	{
	  Info.LabelSetType = LS_MXF_SMPTE;
	  fprintf(stderr, "ATTENTION! Writing SMPTE Universal Labels\n");
	}

#ifdef HAVE_OPENSSL
      // configure encryption
      if( Options.key_flag )
	{
          Kumu::FortunaRNG RNG;

	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	  else
	    RNG.FillRandom(Info.CryptographicKeyID, UUIDlen);

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
	    {
	      Info.UsesHMAC = true;
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	}
#endif // HAVE_OPENSSL

      if ( ASDCP_SUCCESS(result) )
	result = Writer.OpenWrite(Options.out_file, Info, PDesc);
    }

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t duration = 0;
      result = ParserLeft.Reset();
      if ( ASDCP_SUCCESS(result) ) result = ParserRight.Reset();

      while ( ASDCP_SUCCESS(result) && duration++ < Options.duration )
	{
	  result = ParserLeft.ReadFrame(FrameBuffer);

	  if ( ASDCP_SUCCESS(result) )
	    {
	      if ( Options.verbose_flag )
		FrameBuffer.Dump(stderr, Options.fb_dump_size);
		  
	      if ( Options.encrypt_header_flag )
		FrameBuffer.PlaintextOffset(0);
	    }

	  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
	    result = Writer.WriteFrame(FrameBuffer, JP2K::SP_LEFT, Context, HMAC);

	  if ( ASDCP_SUCCESS(result) )
	    result = ParserRight.ReadFrame(FrameBuffer);

	  if ( ASDCP_SUCCESS(result) )
	    {
	      if ( Options.verbose_flag )
		FrameBuffer.Dump(stderr, Options.fb_dump_size);
		  
	      if ( Options.encrypt_header_flag )
		FrameBuffer.PlaintextOffset(0);
	    }

	  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
	    result = Writer.WriteFrame(FrameBuffer, JP2K::SP_RIGHT, Context, HMAC);
	}

      if ( result == RESULT_ENDOFFILE )
	result = RESULT_OK;
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    result = Writer.Finalize();

  return result;
}